

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O1

matd_plu_t * matd_plu(matd_t *a)

{
  matd_t *pmVar1;
  matd_t mVar2;
  uint uVar3;
  undefined1 *__src;
  matd_t *__dest;
  uint *puVar4;
  matd_t *pmVar5;
  ulong uVar6;
  undefined1 *__dest_00;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  double dVar16;
  undefined1 auStack_88 [8];
  ulong local_80;
  ulong local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  matd_t *local_60;
  matd_t *local_58;
  uint *local_50;
  matd_plu_t *local_48;
  int local_3c;
  matd_t *local_38;
  
  puVar4 = (uint *)calloc((ulong)a->nrows,4);
  pmVar5 = matd_copy(a);
  uVar3 = a->nrows;
  if (uVar3 != a->ncols) {
    __assert_fail("a->nrows == a->ncols",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x5df,"matd_plu_t *matd_plu(const matd_t *)");
  }
  local_48 = (matd_plu_t *)calloc(1,0x20);
  if ((ulong)uVar3 != 0) {
    uVar6 = 0;
    do {
      puVar4[uVar6] = (uint)uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar3 != uVar6);
  }
  local_50 = puVar4;
  if (a->ncols == 0) {
    local_3c = 1;
  }
  else {
    local_38 = pmVar5 + 1;
    local_3c = 1;
    uVar6 = 1;
    local_70 = auStack_88;
    uVar13 = 0;
    local_58 = a;
    do {
      uVar3 = a->nrows;
      uVar9 = (uint)uVar13;
      if ((ulong)uVar3 != 0) {
        uVar8 = pmVar5->ncols;
        uVar10 = 0;
        do {
          uVar11 = uVar10;
          if (uVar13 < uVar10) {
            uVar11 = uVar13;
          }
          uVar7 = (uint)uVar10;
          uVar12 = uVar9;
          if (uVar7 < uVar9) {
            uVar12 = uVar7;
          }
          if (uVar12 == 0) {
            dVar16 = 0.0;
          }
          else {
            uVar12 = pmVar5->ncols * uVar7;
            dVar16 = 0.0;
            uVar14 = uVar13 & 0xffffffff;
            do {
              dVar16 = dVar16 + (double)pmVar5[(ulong)uVar12 + 1] * (double)pmVar5[uVar14 + 1];
              uVar14 = (ulong)((int)uVar14 + pmVar5->ncols);
              uVar12 = uVar12 + 1;
              uVar11 = uVar11 - 1;
            } while (uVar11 != 0);
          }
          uVar11 = (ulong)(uVar8 * uVar7 + uVar9);
          pmVar5[uVar11 + 1] = (matd_t)((double)pmVar5[uVar11 + 1] - dVar16);
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar3);
      }
      local_78 = uVar13 + 1;
      uVar10 = uVar13 & 0xffffffff;
      if (local_78 < pmVar5->nrows) {
        uVar3 = pmVar5->ncols;
        uVar8 = uVar3 * (int)uVar6 + uVar9;
        uVar10 = uVar13 & 0xffffffff;
        uVar11 = uVar6;
        do {
          uVar14 = uVar11 & 0xffffffff;
          if (ABS((double)pmVar5[(ulong)uVar8 + 1]) <=
              ABS((double)pmVar5[(ulong)(uVar3 * (int)uVar10 + uVar9) + 1])) {
            uVar14 = uVar10;
          }
          uVar10 = uVar14;
          uVar11 = uVar11 + 1;
          uVar8 = uVar8 + uVar3;
        } while (pmVar5->nrows != uVar11);
      }
      iVar15 = (int)uVar10;
      if (uVar13 != uVar10) {
        __dest_00 = local_70 + -((ulong)pmVar5->ncols * 8 + 0xf & 0xfffffffffffffff0);
        uVar3 = pmVar5->ncols;
        pmVar1 = local_38 + uVar3 * iVar15;
        local_80 = uVar6;
        local_68 = __dest_00;
        local_60 = pmVar1;
        *(undefined8 *)(__dest_00 + -8) = 0x3fb989;
        memcpy(__dest_00,pmVar1,(ulong)uVar3 << 3);
        a = local_58;
        __dest = local_60;
        uVar6 = local_80;
        pmVar1 = local_38 + uVar3 * uVar9;
        *(undefined8 *)(__dest_00 + -8) = 0x3fb9a9;
        memcpy(__dest,pmVar1,(ulong)uVar3 << 3);
        __src = local_68;
        uVar3 = pmVar5->ncols;
        pmVar1 = local_38 + uVar3 * uVar9;
        *(undefined8 *)(__dest_00 + -8) = 0x3fb9c8;
        memcpy(pmVar1,__src,(ulong)uVar3 << 3);
        uVar3 = local_50[iVar15];
        local_50[iVar15] = local_50[uVar13];
        local_50[uVar13] = uVar3;
        local_3c = -local_3c;
      }
      uVar3 = pmVar5->ncols;
      mVar2 = pmVar5[(ulong)(uVar9 * (uVar3 + 1)) + 1];
      if (ABS((double)mVar2) < 1e-08) {
        local_48->singular = 1;
      }
      if ((((uVar13 < uVar3) && (uVar10 = (ulong)pmVar5->nrows, uVar13 < uVar10)) &&
          (((double)mVar2 != 0.0 || (NAN((double)mVar2))))) && (local_78 < uVar10)) {
        uVar9 = uVar3 * (int)uVar6 + uVar9;
        do {
          pmVar5[(ulong)uVar9 + 1] =
               (matd_t)((double)pmVar5[(ulong)uVar9 + 1] * (1.0 / (double)mVar2));
          uVar9 = uVar9 + uVar3;
          uVar10 = uVar10 - 1;
        } while (uVar6 != uVar10);
      }
      uVar6 = uVar6 + 1;
      uVar13 = local_78;
    } while (local_78 < a->ncols);
  }
  local_48->lu = pmVar5;
  local_48->piv = local_50;
  local_48->pivsign = local_3c;
  return local_48;
}

Assistant:

matd_plu_t *matd_plu(const matd_t *a)
{
    unsigned int *piv = calloc(a->nrows, sizeof(unsigned int));
    int pivsign = 1;
    matd_t *lu = matd_copy(a);

    // only for square matrices.
    assert(a->nrows == a->ncols);

    matd_plu_t *mlu = calloc(1, sizeof(matd_plu_t));

    for (int i = 0; i < a->nrows; i++)
        piv[i] = i;

    for (int j = 0; j < a->ncols; j++) {
        for (int i = 0; i < a->nrows; i++) {
            int kmax = i < j ? i : j; // min(i,j)

            // compute dot product of row i with column j (up through element kmax)
            double acc = 0;
            for (int k = 0; k < kmax; k++)
                acc += MATD_EL(lu, i, k) * MATD_EL(lu, k, j);

            MATD_EL(lu, i, j) -= acc;
        }

        // find pivot and exchange if necessary.
        int p = j;
        if (1) {
            for (int i = j+1; i < lu->nrows; i++) {
                if (fabs(MATD_EL(lu,i,j)) > fabs(MATD_EL(lu, p, j))) {
                    p = i;
                }
            }
        }

        // swap rows p and j?
        if (p != j) {
            TYPE tmp[lu->ncols];
            memcpy(tmp, &MATD_EL(lu, p, 0), sizeof(TYPE) * lu->ncols);
            memcpy(&MATD_EL(lu, p, 0), &MATD_EL(lu, j, 0), sizeof(TYPE) * lu->ncols);
            memcpy(&MATD_EL(lu, j, 0), tmp, sizeof(TYPE) * lu->ncols);
            int k = piv[p];
            piv[p] = piv[j];
            piv[j] = k;
            pivsign = -pivsign;
        }

        double LUjj = MATD_EL(lu, j, j);

        // If our pivot is very small (which means the matrix is
        // singular or nearly singular), replace with a new pivot of the
        // right sign.
        if (fabs(LUjj) < MATD_EPS) {
/*
            if (LUjj < 0)
                LUjj = -MATD_EPS;
            else
                LUjj = MATD_EPS;

            MATD_EL(lu, j, j) = LUjj;
*/
            mlu->singular = 1;
        }

        if (j < lu->ncols && j < lu->nrows && LUjj != 0) {
            LUjj = 1.0 / LUjj;
            for (int i = j+1; i < lu->nrows; i++)
                MATD_EL(lu, i, j) *= LUjj;
        }
    }

    mlu->lu = lu;
    mlu->piv = piv;
    mlu->pivsign = pivsign;

    return mlu;
}